

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

int rankResourceImplementationPairs
              (long preferenceFlags,long requirementFlags,PairedList *possibleResources,
              RsrcImplList *possibleResourceImplementations)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  _List_node_base *p_Var4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  int iVar10;
  int iVar11;
  int iVar13;
  _List_node_base *p_Var14;
  ulong uVar12;
  
  std::__cxx11::list<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
  sort<bool(*)(std::pair<int,int>const&,std::pair<int,int>const&)>
            ((list<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)possibleResources,
             compareOnFirst);
  p_Var9 = (_List_node_base *)implFactory_abi_cxx11_;
  for (p_Var4 = (possibleResources->
                super__List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)possibleResources;
      p_Var4 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    p_Var14 = (((_List_base<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>
                 *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var14 != p_Var9) {
      iVar2 = *(int *)((long)&p_Var4[1]._M_next + 4);
      iVar3 = *(int *)&p_Var4[1]._M_next;
      uVar5 = rsrcList->list[iVar2].requiredFlags;
      uVar6 = rsrcList->list[iVar2].supportFlags;
      do {
        uVar7 = (**(code **)(*(long *)p_Var14[1]._M_next + 0x10))();
        if (((requirementFlags <= (long)(uVar7 & requirementFlags)) &&
            ((long)uVar5 <= (long)(uVar7 & uVar5))) &&
           (requirementFlags <= (long)(uVar6 & requirementFlags))) {
          iVar11 = 1;
          iVar13 = 0x20;
          iVar10 = 0;
          do {
            uVar12 = (ulong)iVar11;
            iVar11 = iVar11 * 2;
            iVar10 = iVar10 + (uint)((uVar7 & uVar12) != 0 && (uVar12 & preferenceFlags) != 0);
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          p_Var9 = p_Var14[1]._M_next;
          p_Var8 = (_List_node_base *)operator_new(0x28);
          *(int *)&p_Var8[1]._M_next = iVar3 - iVar10;
          *(int *)&p_Var8[1]._M_prev = iVar2;
          p_Var8[2]._M_next = p_Var9;
          std::__detail::_List_node_base::_M_hook(p_Var8);
          psVar1 = &(possibleResourceImplementations->
                    super__List_base<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>,_std::allocator<std::pair<int,_std::pair<int,_beagle::BeagleImplFactory_*>_>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        p_Var14 = p_Var14->_M_next;
        p_Var9 = (_List_node_base *)implFactory_abi_cxx11_;
      } while (p_Var14 != (_List_node_base *)implFactory_abi_cxx11_);
    }
  }
  std::__cxx11::
  list<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>,std::allocator<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>>>
  ::
  sort<bool(*)(std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>const&,std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>const&)>
            ((list<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>,std::allocator<std::pair<int,std::pair<int,beagle::BeagleImplFactory*>>>>
              *)possibleResourceImplementations,compareRsrcImpl);
  return 0;
}

Assistant:

int rankResourceImplementationPairs(long preferenceFlags,
                                    long requirementFlags,
                                    PairedList* possibleResources,
                                    RsrcImplList* possibleResourceImplementations) {

    possibleResources->sort(compareOnFirst); // Attempt in rank order, lowest score wins

    // Score each resource-implementation pair given preferences

    for(PairedList::iterator it = possibleResources->begin();
        it != possibleResources->end(); ++it) {
        int resource = (*it).second;
        long resourceRequiredFlags = rsrcList->list[resource].requiredFlags;
        long resourceSupportedFlags = rsrcList->list[resource].supportFlags;
        int resourceScore = (*it).first;
#ifdef BEAGLE_DEBUG_FLOW
        fprintf(stderr,"Possible resource: %s (%d)\n",rsrcList->list[resource].name,resourceScore);
#endif

        for (std::list<beagle::BeagleImplFactory*>::iterator factory =
             implFactory->begin(); factory != implFactory->end(); factory++) {
            long factoryFlags = (*factory)->getFlags();
#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr,"\tExamining implementation: %s\n",(*factory)->getName());
#endif
            if ( ((requirementFlags & factoryFlags) >= requirementFlags) // Factory meets requirementFlags
                && ((resourceRequiredFlags & factoryFlags) >= resourceRequiredFlags) // Factory meets resourceFlags
                && ((requirementFlags & resourceSupportedFlags) >= requirementFlags) // Resource meets requirementFlags
                ) {
                int implementationScore = scoreFlags(preferenceFlags,factoryFlags);
                int totalScore = resourceScore + implementationScore;
#ifdef BEAGLE_DEBUG_FLOW
                fprintf(stderr,"\tPossible implementation: %s (%d)\n",
                        (*factory)->getName(),totalScore);
#endif

                possibleResourceImplementations->push_back(std::make_pair(totalScore, std::make_pair(resource, (*factory))));

            }
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr,"\nOriginal list of possible implementations:\n");
    for (RsrcImplList::iterator it = possibleResourceImplementations->begin();
            it != possibleResourceImplementations->end(); ++it) {
        beagle::BeagleImplFactory* factory = (*it).second.second;
        fprintf(stderr,"\t %s (%d)\n", factory->getName(), (*it).first);
    }
#endif

    possibleResourceImplementations->sort(compareRsrcImpl);

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr,"\nSorted list of possible implementations:\n");
    for (RsrcImplList::iterator it = possibleResourceImplementations->begin();
            it != possibleResourceImplementations->end(); ++it) {
        beagle::BeagleImplFactory* factory = (*it).second.second;
        fprintf(stderr,"\t %s (%d)  (%d)\n", factory->getName(), (*it).first, (*it).second.first);
    }
#endif


    return BEAGLE_SUCCESS;
}